

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall Clasp::DeleteObject::operator()(DeleteObject *this,Accu *p)

{
  Accu *in_RSI;
  
  if (in_RSI != (Accu *)0x0) {
    ClaspFacade::Statistics::ClingoView::Accu::~Accu(in_RSI);
    operator_delete(in_RSI);
  }
  return;
}

Assistant:

void operator()(T* p) const { delete p; }